

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::_mod_minus1_plus1(Group *this,uint16_t member_index,float value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_RDX;
  Atom local_20 [4];
  float local_1c;
  float local_18;
  float v;
  float value_local;
  uint16_t member_index_local;
  Group *this_local;
  
  local_18 = value;
  v._2_2_ = member_index;
  _value_local = this;
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,(ulong)member_index,in_RDX,member_index);
  local_1c = (float)r_code::Atom::asFloat();
  local_1c = local_1c + local_18;
  if (-1.0 <= local_1c) {
    if (1.0 < local_1c) {
      local_1c = 1.0;
    }
  }
  else {
    local_1c = -1.0;
  }
  r_code::Atom::Float(local_1c);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,(ulong)v._2_2_);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_20);
  r_code::Atom::~Atom(local_20);
  return;
}

Assistant:

void Group::_mod_minus1_plus1(uint16_t member_index, float value)
{
    float v = code(member_index).asFloat() + value;

    if (v < -1) {
        v = -1;
    } else if (v > 1) {
        v = 1;
    }

    code(member_index) = Atom::Float(v);
}